

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_log.cxx
# Opt level: O0

void __thiscall xray_re::xr_log::diagnostic(xr_log *this,char *format,__va_list_tag *ap)

{
  int iVar1;
  int n;
  __va_list_tag *ap_local;
  char *format_local;
  xr_log *this_local;
  
  iVar1 = vsnprintf(this->m_buf_p,this->m_buf_size,format,ap);
  if (-1 < iVar1) {
    if (this->m_log != (xr_writer *)0x0) {
      xr_writer::w_s(this->m_log,this->m_buf);
    }
    this->m_buf_p[iVar1] = '\n';
    this->m_buf_p[iVar1 + 1] = '\0';
    std::operator<<((ostream *)&std::cerr,this->m_buf_p);
  }
  return;
}

Assistant:

void xr_log::diagnostic(const char* format, va_list ap)
{
#if defined(_MSC_VER) && _MSC_VER >= 1400
	int n = vsprintf_s(m_buf_p, m_buf_size, format, ap);
#else
	int n = vsnprintf(m_buf_p, m_buf_size, format, ap);
#endif
	if (n >= 0) {
		if (m_log)
			m_log->w_s(m_buf);
		// m_buf_size initialization in constructor assures
		// there is space for extra '\0'.
		m_buf_p[n] = '\n';
		m_buf_p[n + 1] = '\0';
		// exclude prefix for the file output
#	if (MAYA_API_VERSION >= 201300) 
		fputs(m_buf_p, stderr);
#	else
		std::cerr << m_buf_p;
#	endif
#if defined(DEBUG) && defined(WIN32)
		OutputDebugString(m_buf_p);
#endif
	}
}